

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::hold(TestMoreStuffImpl *this,HoldContext context)

{
  _func_int *p_Var1;
  undefined8 *puVar2;
  long *plVar3;
  int iVar4;
  undefined8 *in_RDX;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  Own<capnp::ClientHook> OVar10;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar11;
  Promise<void> PVar12;
  Reader params;
  PointerReader local_98;
  PointerReader local_78;
  StructReader local_58;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  (**(code **)*in_RDX)(&local_98);
  local_78.pointer = local_98.pointer;
  local_78.nestingLimit = local_98.nestingLimit;
  local_78._28_4_ = local_98._28_4_;
  PointerReader::getStruct(&local_58,&local_78,(word *)0x0);
  bVar5 = local_58.pointerCount != 0;
  local_78.pointer = (WirePointer *)0x0;
  if (bVar5) {
    local_78.pointer = local_58.pointers;
  }
  iVar4 = 0x7fffffff;
  if (bVar5) {
    iVar4 = local_58.nestingLimit;
  }
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  uVar9 = 0;
  if (bVar5) {
    uVar6 = local_58.segment._0_4_;
    uVar7 = local_58.segment._4_4_;
    uVar8 = local_58.capTable._0_4_;
    uVar9 = local_58.capTable._4_4_;
  }
  local_78.segment = (SegmentReader *)CONCAT44(uVar7,uVar6);
  local_78.capTable = (CapTableReader *)CONCAT44(uVar9,uVar8);
  local_78.nestingLimit = iVar4;
  OVar10 = PointerReader::getCapability(&local_98);
  p_Var1 = context.hook[3]._vptr_CallContextHook[-3];
  puVar2 = *(undefined8 **)(p_Var1 + (long)&context.hook[3]._vptr_CallContextHook);
  plVar3 = *(long **)(p_Var1 + (long)&context.hook[4]._vptr_CallContextHook);
  p_Var1 = p_Var1 + (long)&context.hook[3]._vptr_CallContextHook;
  *(undefined4 *)p_Var1 = local_98.segment._0_4_;
  *(undefined4 *)(p_Var1 + 4) = local_98.segment._4_4_;
  *(undefined4 *)(p_Var1 + 8) = local_98.capTable._0_4_;
  *(undefined4 *)(p_Var1 + 0xc) = local_98.capTable._4_4_;
  if (plVar3 != (long *)0x0) {
    (**(code **)*puVar2)(puVar2,(long)plVar3 + *(long *)(*plVar3 + -0x10),OVar10.ptr);
  }
  OVar11 = kj::heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_78);
  PVar12.super_PromiseBase.node.ptr = OVar11.ptr;
  *(SegmentReader **)&this->super_Server = local_78.segment;
  *(CapTableReader **)&(this->super_Server).field_0x8 = local_78.capTable;
  PVar12.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar12.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::hold(HoldContext context) {
  ++callCount;

  auto params = context.getParams();
  clientToHold = params.getCap();
  return kj::READY_NOW;
}